

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftinit.c
# Opt level: O3

void FT_Add_Default_Modules(FT_Library library)

{
  FT_Module_Class *clazz;
  FT_Module_Class **ppFVar1;
  
  clazz = &autofit_module_class;
  ppFVar1 = ft_default_modules;
  do {
    ppFVar1 = ppFVar1 + 1;
    FT_Add_Module(library,clazz);
    clazz = *ppFVar1;
  } while (clazz != (FT_Module_Class *)0x0);
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Add_Default_Modules( FT_Library  library )
  {
    FT_Error                       error;
    const FT_Module_Class* const*  cur;


    /* GCC 4.6 warns the type difference:
     *   FT_Module_Class** != const FT_Module_Class* const*
     */
    cur = (const FT_Module_Class* const*)ft_default_modules;

    /* test for valid `library' delayed to FT_Add_Module() */
    while ( *cur )
    {
      error = FT_Add_Module( library, *cur );
      /* notify errors, but don't stop */
      if ( error )
        FT_TRACE0(( "FT_Add_Default_Module:"
                    " Cannot install `%s', error = 0x%x\n",
                    (*cur)->module_name, error ));
      cur++;
    }
  }